

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileutils.c
# Opt level: O0

X509 * read_cert(char *filename)

{
  FILE *fp;
  X509 *res;
  FILE *file;
  char *filename_local;
  
  fp = fopen(filename,"r");
  if (fp == (FILE *)0x0) {
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)PEM_read_X509(fp,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
    if ((X509 *)filename_local == (X509 *)0x0) {
      ERR_print_errors_fp(_stderr);
    }
    fclose(fp);
  }
  return (X509 *)filename_local;
}

Assistant:

X509 *
read_cert(const char *filename)
{
	FILE *file;
	X509 *res;

	if (
#ifdef WIN32
		(fopen_s(&file, filename, "r"))
#else
		!(file = fopen(filename, "r"))
#endif
		)
	{
		return NULL;
	}

	if (!(res = PEM_read_X509(file, NULL, NULL, NULL)))
		ERR_print_errors_fp(stderr);

	fclose(file);

	return res;
}